

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_Mapping.cpp
# Opt level: O1

void * __thiscall
axl::io::psx::Mapping::map
          (Mapping *this,void *addrHint,size_t size,int protection,uint_t flags,int fd,size_t offset
          )

{
  void *pvVar1;
  
  if (this->m_p != (void *)0x0) {
    munmap(this->m_p,this->m_size);
    this->m_p = (void *)0x0;
    this->m_size = 0;
  }
  pvVar1 = mmap(addrHint,size,protection,flags,fd,offset);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    err::setLastSystemError();
    pvVar1 = (void *)0x0;
  }
  else {
    this->m_p = pvVar1;
    this->m_size = size;
  }
  return pvVar1;
}

Assistant:

void*
Mapping::map(
	void* addrHint,
	size_t size,
	int protection,
	uint_t flags,
	int fd,
	size_t offset
) {
	close();

	void* p = ::mmap(addrHint, size, protection, flags, fd, offset);
	if (p == (void*)-1) {
		err::setLastSystemError();
		return NULL;
	}

	m_p = p;
	m_size = size;
	return m_p;
}